

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::FileOptions::FileOptions(FileOptions *this)

{
  FileOptions *this_local;
  
  Message::Message(&this->super_Message);
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__FileOptions_00411080;
  internal::ExtensionSet::ExtensionSet(&this->_extensions_);
  UnknownFieldSet::UnknownFieldSet(&this->_unknown_fields_);
  RepeatedPtrField<google::protobuf::UninterpretedOption>::RepeatedPtrField
            (&this->uninterpreted_option_);
  SharedCtor(this);
  return;
}

Assistant:

FileOptions::FileOptions()
  : ::google::protobuf::Message() {
  SharedCtor();
}